

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O1

TreeNode * si9ma::BinaryTree::generate_node(string *str)

{
  char *__nptr;
  int iVar1;
  TreeNode *this;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  char *local_30;
  
  iVar1 = std::__cxx11::string::compare((char *)str);
  if (iVar1 == 0) {
    return (TreeNode *)0x0;
  }
  this = (TreeNode *)operator_new(0x20);
  __nptr = (str->_M_dataplus)._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(__nptr,&local_30,10);
  if (local_30 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    TreeNode::TreeNode(this,(int)lVar3);
    return this;
  }
  uVar4 = std::__throw_out_of_range("stoi");
  operator_delete(this);
  _Unwind_Resume(uVar4);
}

Assistant:

TreeNode* BinaryTree::generate_node(string str) {
        if ("#" == str)
            return nullptr;

        return new TreeNode(stoi(str));
    }